

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_11::NameApplier::OnTableInitExpr(NameApplier *this,TableInitExpr *expr)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = UseNameForElemSegmentVar(this,&expr->segment_index);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = UseNameForTableVar(this,&expr->table_index);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result NameApplier::OnTableInitExpr(TableInitExpr* expr)  {
  CHECK_RESULT(UseNameForElemSegmentVar(&expr->segment_index));
  CHECK_RESULT(UseNameForTableVar(&expr->table_index));
  return Result::Ok;
}